

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::round_up_abs(char *ext,int keep_digits)

{
  int iVar1;
  size_t i;
  uint uVar2;
  
  i = (size_t)keep_digits;
  iVar1 = keep_digits * 4;
  do {
    iVar1 = iVar1 + -4;
    i = i - 1;
    if (i == 0xffffffffffffffff) {
      shift_right(ext,1);
      *(short *)(ext + 2) = *(short *)(ext + 2) + 1;
      ext[5] = ext[5] & 0xfU | 0x10;
LAB_00230a83:
      ext[4] = ext[4] & 0xf7;
      return;
    }
    uVar2 = (uint)(int)ext[(i >> 1) + 5] >> (~(byte)iVar1 & 4) & 0xf;
    if (uVar2 < 9) {
      set_dig(ext,i,uVar2 + 1);
      goto LAB_00230a83;
    }
    ext[(i >> 1) + 5] = '\x0f' << ((byte)iVar1 & 4) & ext[(i >> 1) + 5];
  } while( true );
}

Assistant:

void CVmObjBigNum::round_up_abs(char *ext, int keep_digits)
{
    /* start with a "carry" into the least significant digit */
    int carry = TRUE;

    /* propagate the carry through the number's digits */
    for (int idx = keep_digits ; idx != 0 ; )
    {
        /* move to the next more significant digit */
        --idx;

        /* add the carry */
        int d = get_dig(ext, idx);
        if (d < 9)
        {
            /* bump it up */
            set_dig(ext, idx, d + 1);

            /* no carrying required, so we can stop now */
            carry = FALSE;
            break;
        }
        else
        {
            /* it's a '9', so bump it up to '0' and carry to the next digit */
            set_dig(ext, idx, 0);
        }
    }

    /* 
     *   If we carried out of the top digit, we must have had all nines, in
     *   which case we now have all zeros.  Put a 1 in the first digit and
     *   increase the exponent to renormalize. 
     */
    if (carry)
    {
        /* shift the mantissa */
        shift_right(ext, 1);

        /* increase the exponent */
        set_exp(ext, get_exp(ext) + 1);
        
        /* set the lead digit to 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is non-zero now */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}